

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_H_upper.c
# Opt level: O2

void test_option_H_upper(void)

{
  wchar_t wVar1;
  
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                       ,L'\'',"in",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'(',"in");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                       ,L')',"d1",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'*',"ld1","d1");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'+',"d1/file1",L'Ƥ',L'\xffffffff',"d1/file1");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L',',"d1/file2",L'Ƥ',L'\xffffffff',"d1/file2");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'-',"d1/link1","file1");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'.',"d1/linkX","fileX");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'/',"link2","d1/file2");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'0',"linkY","d1/fileY");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'1',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                       ,L'4',"test1",L'ǭ');
    wVar1 = systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'6',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'7',"test1");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'9',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L':',"ld1","d1");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L';',"d1/link1","file1");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'<',"d1/linkX","fileX");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'=',"link2","d1/file2");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'>',"linkY","d1/fileY");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'?',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                       ,L'B',"test2",L'ǭ');
    wVar1 = systemf("%s -cf test2/archive.tar -H -C in . >test2/c.out 2>test2/c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'D',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test2/archive.tar -H -C in . >test2/c.out 2>test2/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'E',"test2");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'G',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'H',"ld1","d1");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'I',"d1/link1","file1");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'J',"d1/linkX","fileX");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'K',"link2","d1/file2");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'L',"linkY","d1/fileY");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'M',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                       ,L'P',"test3",L'ǭ');
    wVar1 = systemf("%s -cf test3/archive.tar -H -C in ld1 d1 link2 linkY >test2/c.out 2>test2/c.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'R',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test3/archive.tar -H -C in ld1 d1 link2 linkY >test2/c.out 2>test2/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'S',"test3");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                        ,L'U',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                     ,L'V',"ld1",L'ǭ');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'W',"d1/linkX","fileX");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'X',"d1/link1","file1");
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                     ,L'Y',"link2",L'Ƥ');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
               ,L'Z',"linkY","d1/fileY");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                    ,L'[',"..");
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_H_upper.c"
                 ,L' ');
  test_skipping("Can\'t test symlinks on this filesystem");
  return;
}

Assistant:

DEFINE_TEST(test_option_H_upper)
{

	if (!canSymlink()) {
		skipping("Can't test symlinks on this filesystem");
		return;
	}

	/*
	 * Create a sample archive.
	 */
	assertMakeDir("in", 0755);
	assertChdir("in");
	assertMakeDir("d1", 0755);
	assertMakeSymlink("ld1", "d1");
	assertMakeFile("d1/file1", 0644, "d1/file1");
	assertMakeFile("d1/file2", 0644, "d1/file2");
	assertMakeSymlink("d1/link1", "file1");
	assertMakeSymlink("d1/linkX", "fileX");
	assertMakeSymlink("link2", "d1/file2");
	assertMakeSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 1: Without -H */
	assertMakeDir("test1", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err", testprog));
	assertChdir("test1");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsSymlink("ld1", "d1");
	assertIsSymlink("d1/link1", "file1");
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("link2", "d1/file2");
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 2: With -H, no symlink on command line. */
	assertMakeDir("test2", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test2/archive.tar -H -C in . >test2/c.out 2>test2/c.err", testprog));
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsSymlink("ld1", "d1");
	assertIsSymlink("d1/link1", "file1");
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("link2", "d1/file2");
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");

	/* Test 3: With -H, some symlinks on command line. */
	assertMakeDir("test3", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test3/archive.tar -H -C in ld1 d1 link2 linkY >test2/c.out 2>test2/c.err", testprog));
	assertChdir("test3");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsDir("ld1", 0755);
	assertIsSymlink("d1/linkX", "fileX");
	assertIsSymlink("d1/link1", "file1");
	assertIsReg("link2", 0644);
	assertIsSymlink("linkY", "d1/fileY");
	assertChdir("..");
}